

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O3

char * __thiscall cppcms::impl::string_pool::allocate_space(string_pool *this,size_t size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  char *pcVar3;
  ulong uVar4;
  
  if (*(ulong *)this < size * 2) {
    puVar2 = (undefined8 *)malloc(size + 0x10);
    if (puVar2 == (undefined8 *)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = &std::cout;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    puVar1 = *(undefined8 **)(this + 8);
    *puVar2 = *puVar1;
    *puVar1 = puVar2;
    pcVar3 = (char *)(puVar2 + 1);
  }
  else {
    uVar4 = *(ulong *)(this + 0x10);
    if (uVar4 < size) {
      add_page(this);
      uVar4 = *(ulong *)(this + 0x10);
    }
    pcVar3 = *(char **)(this + 0x18);
    *(char **)(this + 0x18) = pcVar3 + size;
    *(ulong *)(this + 0x10) = uVar4 - size;
  }
  return pcVar3;
}

Assistant:

char *allocate_space(size_t size)
			{
				if(size * 2 > page_size_) {
					page *p=(page *)malloc(size + sizeof(page));
					if(!p)
						throw std::bad_alloc();
					p->next = pages_->next;
					pages_->next = p;
					return p->data;
				}
				if(size > free_space_) {
					add_page();
				}
				char *result = data_;
				data_+=size;
				free_space_ -= size;
				return result;
			}